

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O0

h__Writer * __thiscall
AS_02::PCM::MXFWriter::h__Writer::WriteFrame
          (h__Writer *this,FrameBuffer *frame_buf,AESEncContext *Ctx,HMACContext *HMAC)

{
  bool bVar1;
  ui32_t uVar2;
  int iVar3;
  ILogSink *this_00;
  undefined1 local_180 [104];
  undefined1 local_118 [104];
  h__WriterState local_b0 [31];
  undefined1 local_31;
  HMACContext *HMAC_local;
  AESEncContext *Ctx_local;
  FrameBuffer *frame_buf_local;
  h__Writer *this_local;
  Result_t *result;
  
  HMAC_local = HMAC;
  Ctx_local = Ctx;
  frame_buf_local = frame_buf;
  this_local = this;
  uVar2 = ASDCP::FrameBuffer::Size((FrameBuffer *)Ctx);
  if (uVar2 == 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"The frame buffer size is zero.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
  }
  else {
    local_31 = 0;
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    bVar1 = ASDCP::MXF::h__WriterState::Test_READY((h__WriterState *)(frame_buf + 0x370));
    if (bVar1) {
      ASDCP::MXF::h__WriterState::Goto_RUNNING(local_b0);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b0);
      Kumu::Result_t::~Result_t((Result_t *)local_b0);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if ((-1 < iVar3) &&
       (bVar1 = h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>::HasOpenClip
                          ((h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR> *)frame_buf), !bVar1))
    {
      h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>::StartClip
                ((h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR> *)local_118,(byte_t *)frame_buf,
                 (AESEncContext *)(frame_buf + 0x5c8),HMAC_local);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_118);
      Kumu::Result_t::~Result_t((Result_t *)local_118);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar3) {
      h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>::WriteClipBlock
                ((h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR> *)local_180,frame_buf);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_180);
      Kumu::Result_t::~Result_t((Result_t *)local_180);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar3) {
      uVar2 = ASDCP::FrameBuffer::Size((FrameBuffer *)Ctx_local);
      *(uint *)(frame_buf + 0x338) =
           uVar2 / *(uint *)(frame_buf + 0x5d8) + *(int *)(frame_buf + 0x338);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::WriteFrame(const FrameBuffer& frame_buf, AESEncContext* Ctx,
					     HMACContext* HMAC)
{
  if ( frame_buf.Size() == 0 )
    {
      DefaultLogSink().Error("The frame buffer size is zero.\n");
      return RESULT_PARAM;
    }

  Result_t result = RESULT_OK;

  if ( m_State.Test_READY() )
    {
      result = m_State.Goto_RUNNING(); // first time through
    }

  if ( KM_SUCCESS(result) && ! HasOpenClip() )
    {
      result = StartClip(m_EssenceUL, Ctx, HMAC);
    }

  if ( KM_SUCCESS(result) )
    {
      result = WriteClipBlock(frame_buf);
    }

  if ( KM_SUCCESS(result) )
    {
      m_FramesWritten += frame_buf.Size() / m_BytesPerSample;
    }

  return result;
}